

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O1

vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> * __thiscall
OpenMD::AtomType::allYourBase
          (vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *__return_storage_ptr__,
          AtomType *this)

{
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->hasBase_ == true) {
    allYourBase(&local_30,this->base_);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::_M_move_assign
              (__return_storage_ptr__,&local_30);
    if (local_30.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_30.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::_M_insert_rval
              (__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
               super__Vector_impl_data._M_start,(value_type *)&local_30);
  }
  else {
    local_30.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>::
    emplace_back<OpenMD::AtomType*>
              ((vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>> *)__return_storage_ptr__
               ,(AtomType **)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AtomType*> AtomType::allYourBase() {
    std::vector<AtomType*> myChain;

    if (hasBase_) {
      myChain = base_->allYourBase();
      myChain.insert(myChain.begin(), this);
    } else {
      myChain.push_back(this);
    }

    return myChain;
  }